

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O2

Reader * __thiscall
capnp::LocalCallContext::getParams(Reader *__return_storage_ptr__,LocalCallContext *this)

{
  MallocMessageBuilder *this_00;
  Fault f;
  PointerBuilder local_28;
  
  this_00 = (this->request).ptr.ptr;
  if (this_00 != (MallocMessageBuilder *)0x0) {
    MessageBuilder::getRootInternal((Builder *)&local_28,&this_00->super_MessageBuilder);
    capnp::_::PointerBuilder::asReader(&local_28);
    return __return_storage_ptr__;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[46]>
            ((Fault *)&local_28,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability.c++"
             ,0x9c,FAILED,(char *)0x0,"\"Can\'t call getParams() after releaseParams().\"",
             (char (*) [46])"Can\'t call getParams() after releaseParams().");
  kj::_::Debug::Fault::fatal((Fault *)&local_28);
}

Assistant:

QueuedPipeline(kj::Promise<kj::Own<PipelineHook>>&& promiseParam)
      : promise(promiseParam.fork()),
        selfResolutionOp(promise.addBranch().then([this](kj::Own<PipelineHook>&& inner) {
          redirect = kj::mv(inner);
        }, [this](kj::Exception&& exception) {
          redirect = newBrokenPipeline(kj::mv(exception));
        }).eagerlyEvaluate(nullptr)) {}